

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_compute_blob.h
# Opt level: O1

void ncnn::gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  size_t sVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  void *pvVar12;
  int *piVar13;
  float fVar14;
  float fVar15;
  uint uVar16;
  uint uVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  iVar9 = grid->h * grid->w;
  piVar13 = (int *)offset_value->data;
  if (permute_fusion == 0) {
    if (0 < grid->c) {
      pvVar12 = grid->data;
      sVar4 = grid->cstep;
      sVar5 = grid->elemsize;
      lVar8 = 0;
      do {
        if (0 < iVar9) {
          lVar11 = 0;
          do {
            uVar1 = *(undefined8 *)((long)pvVar12 + lVar11 * 4);
            uVar3 = src->w;
            uVar7 = src->h;
            auVar22._0_4_ = ((float)uVar1 * 0.5 + 0.5) * (float)(int)uVar3 + -0.5;
            auVar22._4_4_ = ((float)((ulong)uVar1 >> 0x20) * 0.5 + 0.5) * (float)(int)uVar7 + -0.5;
            auVar22._8_8_ = 0;
            auVar23 = maxps(auVar22,ZEXT816(0));
            auVar20._0_4_ = (float)(int)uVar3 + -1.0;
            auVar20._4_4_ = (float)(int)uVar7 + -1.0;
            auVar20._8_8_ = 0;
            auVar20 = minps(auVar20,auVar23);
            fVar14 = floorf(auVar20._0_4_ + 0.5);
            fVar15 = floorf(auVar20._4_4_ + 0.5);
            uVar16 = (uint)fVar14;
            uVar18 = (uint)fVar15;
            auVar23._4_4_ = -(uint)((int)uVar16 < (int)uVar3);
            auVar23._0_4_ = -(uint)((int)uVar16 < (int)uVar3);
            auVar23._8_4_ = -(uint)((int)uVar18 < (int)uVar7);
            auVar23._12_4_ = -(uint)((int)uVar18 < (int)uVar7);
            iVar10 = (uVar3 * uVar18 + uVar16) * src->elempack;
            if ((int)(uVar18 | uVar16) < 0) {
              iVar10 = -1;
            }
            uVar16 = movmskpd(uVar16,auVar23);
            if ((uVar16 & 1) == 0) {
              iVar10 = -1;
            }
            if ((uVar16 & 2) == 0) {
              iVar10 = -1;
            }
            *piVar13 = iVar10;
            piVar13 = piVar13 + 1;
            lVar11 = lVar11 + 2;
          } while ((int)lVar11 < iVar9);
        }
        lVar8 = lVar8 + 1;
        pvVar12 = (void *)((long)pvVar12 + sVar4 * sVar5);
      } while (lVar8 < grid->c);
    }
  }
  else if (0 < iVar9) {
    pvVar12 = grid->data;
    sVar4 = grid->elemsize;
    sVar5 = grid->cstep;
    lVar8 = 0;
    do {
      uVar2 = src->w;
      uVar6 = src->h;
      auVar19._0_4_ = (*(float *)((long)pvVar12 + lVar8 * 4) * 0.5 + 0.5) * (float)(int)uVar2 + -0.5
      ;
      auVar19._4_4_ =
           (*(float *)((long)pvVar12 + lVar8 * 4 + sVar4 * sVar5) * 0.5 + 0.5) * (float)(int)uVar6 +
           -0.5;
      auVar19._8_8_ = 0;
      auVar20 = maxps(auVar19,_DAT_005ee010);
      auVar21._0_4_ = (float)(int)uVar2 + -1.0;
      auVar21._4_4_ = (float)(int)uVar6 + -1.0;
      auVar21._8_8_ = 0;
      auVar20 = minps(auVar21,auVar20);
      fVar14 = floorf(auVar20._0_4_ + 0.5);
      fVar15 = floorf(auVar20._4_4_ + 0.5);
      uVar16 = (uint)fVar14;
      uVar18 = (uint)fVar15;
      iVar10 = (uVar2 * uVar18 + uVar16) * src->elempack;
      auVar17._4_4_ = -(uint)((int)uVar16 < (int)uVar2);
      auVar17._0_4_ = -(uint)((int)uVar16 < (int)uVar2);
      auVar17._8_4_ = -(uint)((int)uVar18 < (int)uVar6);
      auVar17._12_4_ = -(uint)((int)uVar18 < (int)uVar6);
      if ((int)(uVar18 | uVar16) < 0) {
        iVar10 = -1;
      }
      uVar16 = movmskpd(uVar16,auVar17);
      if ((uVar16 & 1) == 0) {
        iVar10 = -1;
      }
      if ((uVar16 & 2) == 0) {
        iVar10 = -1;
      }
      piVar13[lVar8] = iVar10;
      lVar8 = lVar8 + 1;
    } while (iVar9 != (int)lVar8);
  }
  return;
}

Assistant:

void gridsample_2d_nearest_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h;

    float* offset_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 15 < grid_size; x += 16)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);

                transpose2x8_ps(gx, gy);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
                gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));

                __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                                  _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));

                __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx), _mm256_set1_ps(src.elempack));

                offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

                _mm256_storeu_ps(offset_ptr, offset);

                gridptr += 16;
                offset_ptr += 8;
            }

#endif // __AVX__

            for (; x < grid_size; x += 2)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                int x0 = static_cast<int>(floorf(sample_x + 0.5f));
                int y0 = static_cast<int>(floorf(sample_y + 0.5f));

                bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h));

                int* iptr = (int*)offset_ptr;
                *iptr = in_bound ? (x0 + y0 * src.w) * src.elempack : -1.0;

                gridptr += 2;
                offset_ptr++;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
            gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));

            __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                              _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));

            __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx), _mm256_set1_ps(src.elempack));

            offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

            _mm256_storeu_ps(offset_ptr, offset);

            gridptr_x += 8;
            gridptr_y += 8;
            offset_ptr += 8;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            int x0 = static_cast<int>(floorf(sample_x + 0.5f));
            int y0 = static_cast<int>(floorf(sample_y + 0.5f));

            bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h));

            int* iptr = (int*)offset_ptr;
            *iptr = in_bound ? (x0 + y0 * src.w) * src.elempack : -1.0;

            gridptr_x++;
            gridptr_y++;

            offset_ptr++;
        }
    }
}